

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<float,_10>::TPZManVector(TPZManVector<float,_10> *this,TPZManVector<float,_10> *rval)

{
  int64_t iVar1;
  TPZVec<float> *in_RSI;
  TPZVec<float> *in_RDI;
  int i;
  int64_t size;
  int local_28;
  
  TPZVec<float>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_023d9e08;
  iVar1 = TPZVec<float>::NElements(in_RSI);
  if (iVar1 < 0xb) {
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      *(undefined4 *)((long)&in_RDI[1]._vptr_TPZVec + (long)local_28 * 4) =
           *(undefined4 *)((long)&in_RSI[1]._vptr_TPZVec + (long)local_28 * 4);
    }
    for (; local_28 < 10; local_28 = local_28 + 1) {
      *(undefined4 *)((long)&in_RDI[1]._vptr_TPZVec + (long)local_28 * 4) = 0;
    }
    in_RDI->fStore = (float *)(in_RDI + 1);
    in_RDI->fNElements = iVar1;
    in_RDI->fNAlloc = 0;
  }
  else {
    in_RDI->fStore = in_RSI->fStore;
    in_RDI->fNElements = iVar1;
    in_RDI->fNAlloc = iVar1;
  }
  in_RSI->fStore = (float *)0x0;
  in_RSI->fNAlloc = 0;
  in_RSI->fNElements = 0;
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(TPZManVector< T, NumExtAlloc >&& rval) {

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (auto size = rval.NElements();size <= NumExtAlloc){
        //we need to copy, unfortunately
        int i = 0;
        for(; i < size; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else {// The size requested is bigger than the size already provided.
        this->fStore = rval.fStore;
        this->fNElements = size;
        this->fNAlloc = size;
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
}